

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme,XMLSize_t schemeLen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  XMLSize_t i;
  ulong uVar4;
  
  bVar1 = XMLString::isAlpha(*scheme);
  if (bVar1) {
    for (uVar4 = 1; bVar1 = schemeLen <= uVar4, !bVar1; uVar4 = uVar4 + 1) {
      bVar2 = XMLString::isAlphaNum(scheme[uVar4]);
      if ((!bVar2) && (iVar3 = XMLString::indexOf(L"+-.",scheme[uVar4]), iVar3 == -1)) {
        return bVar1;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool XMLUri::isConformantSchemeName( const XMLCh* const scheme
                                   , const XMLSize_t schemeLen)
{
    if (!XMLString::isAlpha(*scheme))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    for (XMLSize_t i=1; i<schemeLen; i++)
    {
        if ( !XMLString::isAlphaNum(scheme[i]) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, scheme[i]) == -1))
            return false;
    }

    return true;
}